

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

Abc_Ntk_t * Io_ReadBlif(char *pFileName,int fCheck)

{
  int iVar1;
  Io_ReadBlif_t *p_00;
  char *pcVar2;
  Abc_Ntk_t *pNtk;
  Io_ReadBlif_t *p;
  int fCheck_local;
  char *pFileName_local;
  
  p_00 = Io_ReadBlifFile(pFileName);
  if (p_00 == (Io_ReadBlif_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)Io_ReadBlifNetwork(p_00);
    if ((Abc_Ntk_t *)pFileName_local == (Abc_Ntk_t *)0x0) {
      Io_ReadBlifFree(p_00);
      pFileName_local = (char *)0x0;
    }
    else {
      pcVar2 = Extra_UtilStrsav(pFileName);
      ((Abc_Ntk_t *)pFileName_local)->pSpec = pcVar2;
      Io_ReadBlifCreateTiming(p_00,(Abc_Ntk_t *)pFileName_local);
      Io_ReadBlifFree(p_00);
      if ((fCheck != 0) && (iVar1 = Abc_NtkCheckRead((Abc_Ntk_t *)pFileName_local), iVar1 == 0)) {
        printf("Io_ReadBlif: The network check has failed.\n");
        Abc_NtkDelete((Abc_Ntk_t *)pFileName_local);
        pFileName_local = (char *)0x0;
      }
    }
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

Abc_Ntk_t * Io_ReadBlif( char * pFileName, int fCheck )
{
    Io_ReadBlif_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Io_ReadBlifFile( pFileName );
    if ( p == NULL )
        return NULL;

    // read the hierarchical network
    pNtk = Io_ReadBlifNetwork( p );
    if ( pNtk == NULL )
    {
        Io_ReadBlifFree( p );
        return NULL;
    }
    pNtk->pSpec = Extra_UtilStrsav( pFileName );
    Io_ReadBlifCreateTiming( p, pNtk );
    Io_ReadBlifFree( p );

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadBlif: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}